

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int64_t av1_rd_pick_intra_sby_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,int64_t best_rd,PICK_MODE_CONTEXT *ctx)

{
  AV1_COMMON *cm;
  BLOCK_SIZE BVar1;
  _Bool _Var2;
  PREDICTION_MODE PVar3;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar4;
  WinnerModeStats *pWVar5;
  uint8_t *__dest;
  MB_RD_RECORD *pMVar6;
  PICK_MODE_CONTEXT *pPVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  TX_SIZE tx_size;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int64_t (*paiVar15) [9];
  int64_t this_model_rd;
  PALETTE_BUFFER *pPVar16;
  TX_MODE TVar17;
  uint uVar18;
  int64_t *piVar19;
  long lVar20;
  double dVar21;
  uint uVar22;
  AV1_COMP *pAVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int mode_idx;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  long local_990;
  int beat_best_rd;
  PALETTE_BUFFER *local_978;
  double local_970;
  int *local_968;
  int local_95c;
  double local_958;
  ulong local_950;
  int *local_948;
  uint8_t *local_940;
  ulong *local_938;
  int *local_930;
  int local_924;
  ulong local_920;
  ulong local_918;
  PALETTE_BUFFER *local_910;
  ulong local_908;
  ulong local_900;
  uint8_t *local_8f8;
  uint8_t directional_mode_skip_mask [13];
  RD_STATS local_8d0;
  int64_t top_intra_model_rd [4];
  MB_MODE_INFO best_mbmi;
  RD_STATS this_rd_stats;
  int64_t aiStack_7b0 [123];
  int64_t intra_modes_rd_cost [13] [9];
  long lVar33;
  
  mbmi = *(x->e_mbd).mi;
  local_910 = (PALETTE_BUFFER *)0x7fffffffffffffff;
  bVar8 = 0;
  directional_mode_skip_mask[8] = '\0';
  directional_mode_skip_mask[9] = '\0';
  directional_mode_skip_mask[10] = '\0';
  directional_mode_skip_mask[0xb] = '\0';
  directional_mode_skip_mask[0xc] = '\0';
  directional_mode_skip_mask[0] = '\0';
  directional_mode_skip_mask[1] = '\0';
  directional_mode_skip_mask[2] = '\0';
  directional_mode_skip_mask[3] = '\0';
  directional_mode_skip_mask[4] = '\0';
  directional_mode_skip_mask[5] = '\0';
  directional_mode_skip_mask[6] = '\0';
  directional_mode_skip_mask[7] = '\0';
  beat_best_rd = 0;
  if ((cpi->oxcf).tool_cfg.enable_palette == true) {
    BVar1 = mbmi->bsize;
    bVar8 = (BLOCK_8X4 < BVar1 && (BVar1 & ~BLOCK_8X4) != BLOCK_64X128) &
            (BVar1 & ~BLOCK_4X8) != BLOCK_128X64 & (cpi->common).features.allow_screen_content_tools
    ;
  }
  if (bVar8 == 0) {
    local_978 = (PALETTE_BUFFER *)0x0;
  }
  else {
    local_978 = x->palette_buffer;
  }
  pMVar4 = (x->e_mbd).left_mbmi;
  local_948 = rate;
  local_940 = skippable;
  local_938 = (ulong *)distortion;
  local_930 = rate_tokenonly;
  bVar9 = av1_above_block_mode((x->e_mbd).above_mbmi);
  bVar10 = av1_left_block_mode(pMVar4);
  iVar27 = intra_mode_context[bVar9];
  iVar11 = intra_mode_context[bVar10];
  mbmi->angle_delta[0] = '\0';
  lVar14 = (long)(cpi->sf).intra_sf.intra_pruning_with_hog;
  uVar26 = (ulong)bsize;
  if (lVar14 != 0) {
    prune_intra_mode_with_hog
              (x,bsize,((cpi->common).seq_params)->sb_size,*(float *)(&DAT_00515ecc + lVar14 * 4),
               directional_mode_skip_mask,0);
  }
  local_968 = (int *)((long)x->plane + (long)iVar27 * 0x2a4);
  (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
  (mbmi->palette_mode_info).palette_size[0] = '\0';
  set_mode_eval_params(cpi,x,'\x01');
  memcpy(&best_mbmi,mbmi,0xb0);
  pWVar5 = x->winner_mode_stats;
  if (pWVar5 != (WinnerModeStats *)0x0) {
    uVar18 = winner_mode_count_allowed[(cpi->sf).winner_mode_sf.multi_winner_mode_type];
    bVar9 = block_size_wide[uVar26];
    bVar10 = block_size_high[uVar26];
    lVar14 = 0;
    do {
      memset((void *)((long)(pWVar5->mbmi).mv + lVar14 + -8),0,0xe8);
      memset(pWVar5->color_index_map + lVar14,0,(ulong)bVar10 * (ulong)bVar9);
      (&pWVar5->mode_index)[lVar14] = '\0';
      lVar14 = lVar14 + 0x40f0;
    } while ((ulong)uVar18 * 0x40f0 - lVar14 != 0);
  }
  local_968 = (int *)((long)local_968 + (long)iVar11 * 0x34 + 0x4620);
  x->winner_mode_count = 0;
  lVar14 = 0;
  do {
    top_intra_model_rd[lVar14] = 0x7fffffffffffffff;
    top_intra_model_rd[lVar14 + 1] = 0x7fffffffffffffff;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 4);
  paiVar15 = intra_modes_rd_cost;
  lVar14 = 0;
  do {
    lVar20 = 1;
    auVar32 = _DAT_004d29e0;
    do {
      if (SUB164(auVar32 ^ _DAT_004d29f0,4) == -0x80000000 &&
          SUB164(auVar32 ^ _DAT_004d29f0,0) < -0x7ffffff7) {
        paiVar15[-1][lVar20 + 8] = 0x7fffffffffffffff;
        (*paiVar15)[lVar20] = 0x7fffffffffffffff;
      }
      lVar33 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + 2;
      auVar32._8_8_ = lVar33 + 2;
      lVar20 = lVar20 + 2;
    } while (lVar20 != 0xb);
    lVar14 = lVar14 + 1;
    paiVar15 = paiVar15 + 1;
  } while (lVar14 != 0xd);
  cm = &cpi->common;
  local_8f8 = (x->txfm_search_info).blk_skip;
  iVar27 = 0;
  do {
    set_y_mode_and_delta_angle(iVar27,mbmi,(cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra);
    uVar24 = (ulong)mbmi->angle_delta[0];
    bVar9 = mbmi->mode;
    if ((((byte)(bVar9 - 9) < 0xfa) || ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra == true))
       && (((byte)(bVar9 - 9) < 0xf8 ||
           ((cpi->oxcf).intra_mode_cfg.enable_directional_intra == true)))) {
      _Var2 = (cpi->oxcf).intra_mode_cfg.enable_smooth_intra;
      if (_Var2 == true) {
        if (((bVar9 & 0xfe) != 10) || ((cpi->sf).intra_sf.disable_smooth_intra == 0)) {
LAB_00258e50:
          if (((((((bVar9 == 9 & (_Var2 ^ 1U)) == 0) &&
                 ((((uVar18 = (uint)bVar9, (cpi->sf).intra_sf.disable_smooth_intra == 0 ||
                    (uVar18 != 9)) || ((cpi->sf).intra_sf.prune_filter_intra_level != 0)) &&
                  ((uVar18 != 0xc || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false))))))
                && ((x->use_mb_mode_cache == 0 || (bVar9 == x->mb_mode_cache->mode)))) &&
               (((byte)(bVar9 - 9) < 0xf8 ||
                ((directional_mode_skip_mask[bVar9] == '\0' &&
                 (((BLOCK_8X4 < bsize && ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != false))
                  || (mbmi->angle_delta[0] == '\0')))))))) &&
              (((uint)(cpi->sf).intra_sf.intra_y_mode_mask[""[uVar26]] >> (uVar18 & 0x1f) & 1) != 0)
              ) && (((((byte)(bVar9 - 9) < 0xf8 ||
                      ((cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra == 0)) ||
                     (best_rd == 0x7fffffffffffffff || (uVar24 & 1) == 0)) ||
                    ((lVar14 = (best_rd >> 3) + best_rd,
                     intra_modes_rd_cost[bVar9][uVar24 + 3] <= lVar14 ||
                     (intra_modes_rd_cost[bVar9][uVar24 + 5] <= lVar14)))))) {
            bVar9 = ""[uVar26];
            if ((bsize & ~BLOCK_8X8) == BLOCK_64X64) {
              bVar9 = 3;
            }
            this_model_rd = intra_model_rd(cm,x,0,bsize,bVar9,1);
            iVar11 = (cpi->sf).intra_sf.top_intra_model_count_allowed;
            if ((cpi->sf).intra_sf.adapt_top_model_rd_count_using_neighbors == 0) {
              iVar13 = iVar11 + -1;
            }
            else {
              PVar3 = (*(x->e_mbd).mi)->mode;
              if ((x->e_mbd).left_available == true) {
                bVar30 = ((x->e_mbd).left_mbmi)->mode != PVar3;
              }
              else {
                bVar30 = false;
              }
              if ((x->e_mbd).up_available == true) {
                bVar31 = ((x->e_mbd).above_mbmi)->mode != PVar3;
              }
              else {
                bVar31 = false;
              }
              iVar13 = iVar11 + -1;
              if (x->qindex < 0x80) {
                if ((bool)(bVar30 | bVar31)) {
LAB_0025900b:
                  if (iVar11 < 3) {
                    iVar11 = 2;
                  }
                  iVar13 = iVar11 + -2;
                }
              }
              else if ((bool)(bVar30 & bVar31)) goto LAB_0025900b;
            }
            pAVar23 = cpi;
            iVar11 = prune_intra_y_mode(this_model_rd,(int64_t *)&local_910,top_intra_model_rd,
                                        (cpi->sf).intra_sf.top_intra_model_count_allowed,iVar13);
            iVar13 = (int)pAVar23;
            if ((iVar11 == 0) &&
               (av1_pick_uniform_tx_size_type_yrd(cpi,x,&this_rd_stats,bsize,best_rd),
               iVar11 = this_rd_stats.rate, this_rd_stats.rate != 0x7fffffff)) {
              local_920 = this_rd_stats.dist;
              local_918 = CONCAT71(local_918._1_7_,this_rd_stats.skip_txfm);
              iVar12 = this_rd_stats.rate;
              if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) &&
                 (mbmi->bsize != BLOCK_4X4)) {
                iVar12 = tx_size_cost(x,bsize,mbmi->tx_size);
                iVar12 = iVar11 - iVar12;
              }
              local_95c = iVar12;
              iVar13 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,local_968[mbmi->mode],iVar13);
              uVar29 = local_920;
              iVar13 = iVar13 + iVar11;
              local_958 = (double)CONCAT44(local_958._4_4_,iVar13);
              dVar21 = (double)(local_920 * 0x80 + ((long)x->rdmult * (long)iVar13 + 0x100 >> 9));
              if (((cpi->oxcf).mode == '\x02') && (dVar21 != NAN)) {
                local_970 = (double)(long)dVar21;
                dVar21 = intra_rd_variance_factor(cpi,x,bsize);
                dVar21 = (double)(long)(dVar21 * local_970);
              }
              intra_modes_rd_cost[mbmi->mode][uVar24 + 4] = (int64_t)dVar21;
              uVar24 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
              if ((dVar21 != NAN && uVar24 != 0) &&
                 ((pWVar5 = x->winner_mode_stats, ((cm->current_frame).frame_type & 0xfd) == 0 ||
                  ((mbmi->palette_mode_info).palette_size[0] == '\0')))) {
                uVar18 = winner_mode_count_allowed[uVar24];
                uVar24 = (ulong)uVar18;
                uVar22 = x->winner_mode_count;
                if ((ulong)uVar22 == 0) {
                  uVar25 = 0;
                  local_970 = dVar21;
                  local_950 = uVar24;
                }
                else {
                  if ((int)uVar22 < 1) {
                    uVar25 = 0;
                  }
                  else {
                    piVar19 = &pWVar5->rd;
                    uVar25 = 0;
                    do {
                      if ((long)dVar21 < *piVar19) goto LAB_00259203;
                      uVar25 = uVar25 + 1;
                      piVar19 = piVar19 + 0x81e;
                    } while (uVar22 != uVar25);
                    uVar25 = (ulong)uVar22;
                  }
LAB_00259203:
                  uVar22 = (uint)uVar25;
                  if (uVar22 == uVar18) goto LAB_002592ab;
                  local_970 = dVar21;
                  local_950 = uVar24;
                  if ((int)uVar22 < (int)(uVar18 - 1)) {
                    memmove(pWVar5 + (uVar25 & 0xffffffff) + 1,pWVar5 + (uVar25 & 0xffffffff),
                            (long)(int)(~uVar22 + uVar18) * 0x40f0);
                  }
                }
                uVar25 = uVar25 & 0xffffffff;
                memcpy(pWVar5 + uVar25,mbmi,0xb0);
                pWVar5[uVar25].rd = (int64_t)local_970;
                pWVar5[uVar25].mode_index = '\0';
                iVar11 = x->winner_mode_count + 1;
                if ((int)local_950 <= iVar11) {
                  iVar11 = (int)local_950;
                }
                x->winner_mode_count = iVar11;
                uVar29 = local_920;
                dVar21 = local_970;
              }
LAB_002592ab:
              if ((long)dVar21 < best_rd) {
                memcpy(&best_mbmi,mbmi,0xb0);
                pPVar7 = ctx;
                beat_best_rd = 1;
                *local_948 = local_958._0_4_;
                *local_930 = local_95c;
                *local_938 = uVar29;
                *local_940 = (uint8_t)local_918;
                best_rd = (int64_t)dVar21;
                memcpy(ctx->blk_skip,local_8f8,(long)ctx->num_4x4_blk);
                memcpy(pPVar7->tx_type_map,(x->e_mbd).tx_type_map,(long)pPVar7->num_4x4_blk);
              }
            }
          }
        }
      }
      else if ((bVar9 & 0xfe) != 10) goto LAB_00258e50;
    }
    iVar27 = iVar27 + 1;
  } while (iVar27 != 0x3d);
  if (bVar8 != 0) {
    av1_rd_pick_palette_intra_sby
              (cpi,x,bsize,*local_968,&best_mbmi,local_978->best_palette_color_map,&best_rd,
               local_948,local_930,(int64_t *)local_938,local_940,&beat_best_rd,ctx,ctx->blk_skip,
               ctx->tx_type_map);
  }
  if ((((beat_best_rd != 0) && (bsize != BLOCK_INVALID)) &&
      (((cpi->common).seq_params)->enable_filter_intra != '\0')) &&
     ((((0x1f07ffUL >> (uVar26 & 0x3f) & 1) != 0 && ((0x2f0bffUL >> (uVar26 & 0x3f) & 1) != 0)) &&
      ((cpi->sf).intra_sf.prune_filter_intra_level != 2)))) {
    local_95c = *local_968;
    local_918 = (ulong)best_mbmi.mode;
    pMVar4 = *(x->e_mbd).mi;
    (pMVar4->filter_intra_mode_info).use_filter_intra = '\x01';
    uVar18 = 0;
    pMVar4->mode = '\0';
    (pMVar4->palette_mode_info).palette_size[0] = '\0';
    if ((x->use_mb_mode_cache == 0) ||
       ((x->mb_mode_cache->filter_intra_mode_info).use_filter_intra != '\0')) {
      local_920 = (ulong)(bsize & 0xfffffffc);
      local_950 = CONCAT71(local_950._1_7_,1);
      local_978 = local_910;
      local_970 = (double)((ulong)local_970 & 0xffffffff00000000);
      local_900 = 0;
      do {
        (pMVar4->filter_intra_mode_info).filter_intra_mode = (FILTER_INTRA_MODE)uVar18;
        if ((((cpi->sf).intra_sf.prune_filter_intra_level != 1) ||
            (("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11"[local_918] >> (uVar18 & 0x1f) & 1
             ) != 0)) &&
           ((x->use_mb_mode_cache == 0 ||
            (uVar18 == (x->mb_mode_cache->filter_intra_mode_info).filter_intra_mode)))) {
          tx_size = '\x03';
          if ((int)local_920 != 0xc) {
            tx_size = ""[uVar26];
          }
          iVar27 = 1;
          pPVar16 = (PALETTE_BUFFER *)intra_model_rd(cm,x,0,bsize,tx_size,1);
          if ((local_978 == (PALETTE_BUFFER *)0x7fffffffffffffff) ||
             ((long)pPVar16 <= (long)(local_978->best_palette_color_map + ((long)local_978 >> 2))))
          {
            if ((long)pPVar16 < (long)local_978) {
              local_978 = pPVar16;
            }
            av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_8d0,bsize,best_rd);
            iVar11 = local_8d0.rate;
            if (local_8d0.rate != 0x7fffffff) {
              iVar27 = intra_mode_info_cost_y(cpi,x,pMVar4,bsize,local_95c,iVar27);
              iVar27 = iVar27 + iVar11;
              dVar21 = (double)(local_8d0.dist * 0x80 +
                               ((long)x->rdmult * (long)iVar27 + 0x100 >> 9));
              if (((cpi->oxcf).mode == '\x02') && (dVar21 != NAN)) {
                local_958 = (double)(long)dVar21;
                dVar21 = intra_rd_variance_factor(cpi,x,bsize);
                dVar21 = (double)(long)(dVar21 * local_958);
              }
              uVar24 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
              if ((dVar21 != NAN && uVar24 != 0) &&
                 ((pWVar5 = x->winner_mode_stats, ((cm->current_frame).frame_type & 0xfd) == 0 ||
                  ((pMVar4->palette_mode_info).palette_size[0] == '\0')))) {
                uVar22 = winner_mode_count_allowed[uVar24];
                uVar24 = (ulong)uVar22;
                uVar28 = x->winner_mode_count;
                if ((ulong)uVar28 == 0) {
                  uVar29 = 0;
                  local_958 = dVar21;
                  local_924 = iVar27;
                  local_908 = uVar24;
                }
                else {
                  if ((int)uVar28 < 1) {
                    uVar29 = 0;
                  }
                  else {
                    piVar19 = &pWVar5->rd;
                    uVar29 = 0;
                    do {
                      if ((long)dVar21 < *piVar19) goto LAB_002596c7;
                      uVar29 = uVar29 + 1;
                      piVar19 = piVar19 + 0x81e;
                    } while (uVar28 != uVar29);
                    uVar29 = (ulong)uVar28;
                  }
LAB_002596c7:
                  uVar28 = (uint)uVar29;
                  if (uVar28 == uVar22) goto LAB_0025977b;
                  local_958 = dVar21;
                  local_924 = iVar27;
                  local_908 = uVar24;
                  if ((int)uVar28 < (int)(uVar22 - 1)) {
                    memmove(pWVar5 + (uVar29 & 0xffffffff) + 1,pWVar5 + (uVar29 & 0xffffffff),
                            (long)(int)(~uVar28 + uVar22) * 0x40f0);
                  }
                }
                uVar29 = uVar29 & 0xffffffff;
                memcpy(pWVar5 + uVar29,pMVar4,0xb0);
                pWVar5[uVar29].rd = (int64_t)local_958;
                pWVar5[uVar29].mode_index = '\0';
                iVar27 = x->winner_mode_count + 1;
                if ((int)local_908 <= iVar27) {
                  iVar27 = (int)local_908;
                }
                x->winner_mode_count = iVar27;
                dVar21 = local_958;
                iVar27 = local_924;
              }
LAB_0025977b:
              pPVar7 = ctx;
              if ((long)dVar21 < best_rd) {
                local_950 = CONCAT71(local_950._1_7_,pMVar4->tx_size);
                local_900 = (ulong)(ushort)pMVar4->filter_intra_mode_info;
                iVar11 = ctx->num_4x4_blk;
                best_rd = (int64_t)dVar21;
                memcpy(&this_rd_stats,(x->e_mbd).tx_type_map,(long)iVar11);
                memcpy(pPVar7->blk_skip,local_8f8,(long)iVar11);
                *local_948 = iVar27;
                *local_930 = local_8d0.rate;
                *local_938 = local_8d0.dist;
                *local_940 = local_8d0.skip_txfm;
                local_970 = (double)CONCAT44(local_970._4_4_,1);
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 5);
      local_910 = local_978;
      if (local_970._0_4_ != 0) {
        pMVar4->mode = '\0';
        pMVar4->tx_size = (TX_SIZE)local_950;
        pMVar4->filter_intra_mode_info = SUB82(local_900,0);
        memcpy(ctx->tx_type_map,&this_rd_stats,(long)ctx->num_4x4_blk);
        memcpy(&best_mbmi,mbmi,0xb0);
      }
    }
  }
  if (beat_best_rd == 0) {
    return 0x7fffffffffffffff;
  }
  if ((cpi->sf).winner_mode_sf.multi_winner_mode_type != '\0') {
    uVar22 = (uint)(block_size_high[uVar26] >> ((byte)(x->e_mbd).plane[0].subsampling_y & 0x1f));
    uVar18 = (uint)(block_size_wide[uVar26] >> ((byte)(x->e_mbd).plane[0].subsampling_x & 0x1f));
    __dest = (x->e_mbd).plane[0].color_index_map;
    local_990 = 0;
    if (0 < x->winner_mode_count) {
      lVar14 = 0;
      uVar26 = 0;
      uVar24 = 0;
      local_978 = (PALETTE_BUFFER *)(ulong)uVar18;
      do {
        memcpy(mbmi,(void *)((long)(x->winner_mode_stats->mbmi).mv + lVar14 + -8),0xb0);
        bVar8 = mbmi->mode;
        iVar27 = (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level;
        if (iVar27 == 3) {
          if (((mbmi->skip_txfm != '\0') && (x->qindex < 0x80)) &&
             (0x18 < bVar8 || (0x86ffffU >> (bVar8 & 0x1f) & 1) != 0)) goto LAB_00259c3b;
LAB_002599ec:
          if (((char)*(ushort *)&mbmi->field_0xa7 < '\0') || ('\0' < mbmi->ref_frame[0])) {
            if (((byte)(bVar8 - 0x19) < 0xf4) ||
               (((cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh == 0x7fffffff ||
                ((cpi->oxcf).txfm_cfg.use_inter_dct_only != false)))) goto LAB_00259a39;
          }
          else if (((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search == 0) ||
                  (((cpi->oxcf).txfm_cfg.use_intra_default_tx_only != false ||
                   ((cpi->oxcf).txfm_cfg.use_intra_dct_only == true)))) {
LAB_00259a39:
            if ((((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt == 0) ||
                ((cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7] & 0xfd) == 0)) &&
               ((cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch == 0))
            goto LAB_00259c3b;
          }
          if ((mbmi->palette_mode_info).palette_size[0] != '\0') {
            memcpy(__dest,x->winner_mode_stats->color_index_map + lVar14,(ulong)(uVar18 * uVar22));
          }
          bVar30 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
          (x->txfm_search_params).use_qm_dist_metric = (uint)bVar30;
          (x->txfm_search_params).use_default_intra_tx_type = 0;
          (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
          (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
          (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2];
          if (bVar30) {
            (x->txfm_search_params).use_transform_domain_distortion = 1;
            (x->txfm_search_params).tx_domain_dist_threshold = 0;
          }
          else {
            if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
              (x->txfm_search_params).use_transform_domain_distortion =
                   (cpi->winner_mode_params).use_transform_domain_distortion[0];
              uVar28 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
            }
            else {
              (x->txfm_search_params).use_transform_domain_distortion =
                   (cpi->winner_mode_params).use_transform_domain_distortion[2];
              uVar28 = (cpi->winner_mode_params).tx_domain_dist_threshold[2];
            }
            (x->txfm_search_params).tx_domain_dist_threshold = uVar28;
          }
          uVar29 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
          (x->txfm_search_params).coeff_opt_thresholds[0] =
               (cpi->winner_mode_params).coeff_opt_thresholds[uVar29 * 2][0];
          (x->txfm_search_params).coeff_opt_thresholds[1] =
               (cpi->winner_mode_params).coeff_opt_thresholds[uVar29 * 2][1];
          iVar27 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
          (x->txfm_search_params).tx_size_search_method =
               (cpi->winner_mode_params).tx_size_search_methods[0];
          if (iVar27 != 0) {
            (x->txfm_search_params).tx_size_search_method =
                 (cpi->winner_mode_params).tx_size_search_methods[2];
          }
          TVar17 = '\x02' - ((x->txfm_search_params).tx_size_search_method == '\x02');
          if ((cpi->common).features.coded_lossless != false) {
            TVar17 = '\0';
          }
          (x->txfm_search_params).tx_mode_search_type = TVar17;
          lVar20 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
          (x->txfm_search_params).prune_2d_txfm_mode =
               (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
          if (lVar20 != 0) {
            (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_0050b2ec + lVar20 * 8);
          }
          if (((x->txfm_search_params).mode_eval_type != 2) &&
             (pMVar6 = (x->txfm_search_info).mb_rd_record, pMVar6 != (MB_RD_RECORD *)0x0)) {
            pMVar6->index_start = 0;
            pMVar6->num = 0;
          }
          (x->txfm_search_params).mode_eval_type = 2;
          iVar27 = intra_block_yrd(cpi,x,bsize,local_968,&best_rd,local_948,local_930,
                                   (int64_t *)local_938,local_940,&best_mbmi,ctx);
          if (iVar27 != 0) {
            uVar24 = uVar26 & 0xffffffff;
          }
        }
        else {
          if (iVar27 == 2) goto LAB_002599ec;
          if (iVar27 == 1) {
            iVar27 = x->qindex * 0x30;
            iVar11 = x->qindex * 0x30 + 0xff;
            if (-1 < iVar27) {
              iVar11 = iVar27;
            }
            if (0x40U - (iVar11 >> 8) <= x->source_variance) goto LAB_002599ec;
          }
          else if (((iVar27 < 4) || ((4 < (cpi->sf).rd_sf.perform_coeff_opt && (x->qindex < 0x47))))
                  || (mbmi->skip_txfm == '\0')) goto LAB_002599ec;
        }
LAB_00259c3b:
        uVar26 = uVar26 + 1;
        lVar14 = lVar14 + 0x40f0;
      } while ((long)uVar26 < (long)x->winner_mode_count);
      local_990 = (long)(int)uVar24;
      uVar18 = (uint)local_978;
    }
    if (best_mbmi.palette_mode_info.palette_size[0] != '\0') {
      memcpy(__dest,x->winner_mode_stats[local_990].color_index_map,(ulong)(uVar18 * uVar22));
    }
    goto LAB_00259f6d;
  }
  bVar8 = mbmi->mode;
  iVar27 = (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level;
  if (iVar27 == 3) {
    if (((mbmi->skip_txfm != '\0') && (x->qindex < 0x80)) &&
       (0x18 < bVar8 || (0x86ffffU >> (bVar8 & 0x1f) & 1) != 0)) goto LAB_00259f6d;
  }
  else if (iVar27 != 2) {
    if (iVar27 == 1) {
      iVar27 = x->qindex * 0x30;
      iVar11 = x->qindex * 0x30 + 0xff;
      if (-1 < iVar27) {
        iVar11 = iVar27;
      }
      if (x->source_variance < 0x40U - (iVar11 >> 8)) goto LAB_00259f6d;
    }
    else if (((3 < iVar27) && (((cpi->sf).rd_sf.perform_coeff_opt < 5 || (0x46 < x->qindex)))) &&
            (mbmi->skip_txfm != '\0')) goto LAB_00259f6d;
  }
  if (((char)*(ushort *)&mbmi->field_0xa7 < '\0') || ('\0' < mbmi->ref_frame[0])) {
    if (((byte)(bVar8 - 0x19) < 0xf4) ||
       (((cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh == 0x7fffffff ||
        ((cpi->oxcf).txfm_cfg.use_inter_dct_only != false)))) goto LAB_00259d8d;
  }
  else if (((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search == 0) ||
          (((cpi->oxcf).txfm_cfg.use_intra_default_tx_only != false ||
           ((cpi->oxcf).txfm_cfg.use_intra_dct_only == true)))) {
LAB_00259d8d:
    if ((((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt == 0) ||
        ((cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7] & 0xfd) == 0)) &&
       ((cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch == 0)) goto LAB_00259f6d;
  }
  bVar30 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
  (x->txfm_search_params).use_qm_dist_metric = (uint)bVar30;
  (x->txfm_search_params).use_default_intra_tx_type = 0;
  (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
  (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
  (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2];
  if (bVar30) {
    (x->txfm_search_params).use_transform_domain_distortion = 1;
    (x->txfm_search_params).tx_domain_dist_threshold = 0;
  }
  else {
    if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
      (x->txfm_search_params).use_transform_domain_distortion =
           (cpi->winner_mode_params).use_transform_domain_distortion[0];
      uVar18 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
    }
    else {
      (x->txfm_search_params).use_transform_domain_distortion =
           (cpi->winner_mode_params).use_transform_domain_distortion[2];
      uVar18 = (cpi->winner_mode_params).tx_domain_dist_threshold[2];
    }
    (x->txfm_search_params).tx_domain_dist_threshold = uVar18;
  }
  uVar26 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
  (x->txfm_search_params).coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[uVar26 * 2][0];
  (x->txfm_search_params).coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[uVar26 * 2][1];
  iVar27 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
  (x->txfm_search_params).tx_size_search_method =
       (cpi->winner_mode_params).tx_size_search_methods[0];
  if (iVar27 != 0) {
    (x->txfm_search_params).tx_size_search_method =
         (cpi->winner_mode_params).tx_size_search_methods[2];
  }
  TVar17 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar17 = '\x02' - ((x->txfm_search_params).tx_size_search_method == '\x02');
  }
  (x->txfm_search_params).tx_mode_search_type = TVar17;
  lVar14 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
  (x->txfm_search_params).prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (lVar14 != 0) {
    (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_0050b2ec + lVar14 * 8);
  }
  if (((x->txfm_search_params).mode_eval_type != 2) &&
     (pMVar6 = (x->txfm_search_info).mb_rd_record, pMVar6 != (MB_RD_RECORD *)0x0)) {
    pMVar6->index_start = 0;
    pMVar6->num = 0;
  }
  (x->txfm_search_params).mode_eval_type = 2;
  memcpy(mbmi,&best_mbmi,0xb0);
  intra_block_yrd(cpi,x,bsize,local_968,&best_rd,local_948,local_930,(int64_t *)local_938,local_940,
                  &best_mbmi,ctx);
LAB_00259f6d:
  memcpy(mbmi,&best_mbmi,0xb0);
  memcpy((x->e_mbd).tx_type_map,ctx->tx_type_map,(long)ctx->num_4x4_blk);
  return best_rd;
}

Assistant:

int64_t av1_rd_pick_intra_sby_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                   int *rate, int *rate_tokenonly,
                                   int64_t *distortion, uint8_t *skippable,
                                   BLOCK_SIZE bsize, int64_t best_rd,
                                   PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int64_t best_model_rd = INT64_MAX;
  int is_directional_mode;
  uint8_t directional_mode_skip_mask[INTRA_MODES] = { 0 };
  // Flag to check rd of any intra mode is better than best_rd passed to this
  // function
  int beat_best_rd = 0;
  const int *bmode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  uint8_t *best_palette_color_map =
      try_palette ? x->palette_buffer->best_palette_color_map : NULL;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];

  mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  if (intra_sf->intra_pruning_with_hog) {
    // Less aggressive thresholds are used here than those used in inter frame
    // encoding in av1_handle_intra_y_mode() because we want key frames/intra
    // frames to have higher quality.
    const float thresh[4] = { -1.2f, -1.2f, -0.6f, 0.4f };
    const int is_chroma = 0;
    prune_intra_mode_with_hog(x, bsize, cpi->common.seq_params->sb_size,
                              thresh[intra_sf->intra_pruning_with_hog - 1],
                              directional_mode_skip_mask, is_chroma);
  }
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  pmi->palette_size[0] = 0;

  // Set params for mode evaluation
  set_mode_eval_params(cpi, x, MODE_EVAL);

  MB_MODE_INFO best_mbmi = *mbmi;
  const int max_winner_mode_count =
      winner_mode_count_allowed[cpi->sf.winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;

  // Searches the intra-modes except for intrabc, palette, and filter_intra.
  int64_t top_intra_model_rd[TOP_INTRA_MODEL_COUNT];
  for (int i = 0; i < TOP_INTRA_MODEL_COUNT; i++) {
    top_intra_model_rd[i] = INT64_MAX;
  }

  // Initialize the rdcost corresponding to all the directional and
  // non-directional intra modes.
  // 1. For directional modes, it stores the rdcost values for delta angles -4,
  // -3, ..., 3, 4.
  // 2. The rdcost value for luma_delta_angle is stored at index
  // luma_delta_angle + MAX_ANGLE_DELTA + 1.
  // 3. The rdcost values for fictitious/nonexistent luma_delta_angle -4 and 4
  // (array indices 0 and 8) are always set to INT64_MAX (the initial value).
  int64_t intra_modes_rd_cost[INTRA_MODE_END]
                             [SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY];
  for (int i = 0; i < INTRA_MODE_END; i++) {
    for (int j = 0; j < SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY; j++) {
      intra_modes_rd_cost[i][j] = INT64_MAX;
    }
  }

  for (int mode_idx = INTRA_MODE_START; mode_idx < LUMA_MODE_COUNT;
       ++mode_idx) {
    set_y_mode_and_delta_angle(mode_idx, mbmi,
                               intra_sf->prune_luma_odd_delta_angles_in_intra);
    RD_STATS this_rd_stats;
    int this_rate, this_rate_tokenonly, s;
    int is_diagonal_mode;
    int64_t this_distortion, this_rd;
    const int luma_delta_angle = mbmi->angle_delta[PLANE_TYPE_Y];

    is_diagonal_mode = av1_is_diagonal_mode(mbmi->mode);
    if (is_diagonal_mode && !intra_mode_cfg->enable_diagonal_intra) continue;
    if (av1_is_directional_mode(mbmi->mode) &&
        !intra_mode_cfg->enable_directional_intra)
      continue;

    // The smooth prediction mode appears to be more frequently picked
    // than horizontal / vertical smooth prediction modes. Hence treat
    // them differently in speed features.
    if ((!intra_mode_cfg->enable_smooth_intra ||
         intra_sf->disable_smooth_intra) &&
        (mbmi->mode == SMOOTH_H_PRED || mbmi->mode == SMOOTH_V_PRED))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && mbmi->mode == SMOOTH_PRED)
      continue;

    // The functionality of filter intra modes and smooth prediction
    // overlap. Hence smooth prediction is pruned only if all the
    // filter intra modes are enabled.
    if (intra_sf->disable_smooth_intra &&
        intra_sf->prune_filter_intra_level == 0 && mbmi->mode == SMOOTH_PRED)
      continue;
    if (!intra_mode_cfg->enable_paeth_intra && mbmi->mode == PAETH_PRED)
      continue;

    // Skip the evaluation of modes that do not match with the winner mode in
    // x->mb_mode_cache.
    if (x->use_mb_mode_cache && mbmi->mode != x->mb_mode_cache->mode) continue;

    is_directional_mode = av1_is_directional_mode(mbmi->mode);
    if (is_directional_mode && directional_mode_skip_mask[mbmi->mode]) continue;
    if (is_directional_mode &&
        !(av1_use_angle_delta(bsize) && intra_mode_cfg->enable_angle_delta) &&
        luma_delta_angle != 0)
      continue;

    // Use intra_y_mode_mask speed feature to skip intra mode evaluation.
    if (!(intra_sf->intra_y_mode_mask[max_txsize_lookup[bsize]] &
          (1 << mbmi->mode)))
      continue;

    if (prune_luma_odd_delta_angles_using_rd_cost(
            mbmi, intra_modes_rd_cost[mbmi->mode], best_rd,
            intra_sf->prune_luma_odd_delta_angles_in_intra))
      continue;

    const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
    const int64_t this_model_rd =
        intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

    const int model_rd_index_for_pruning =
        get_model_rd_index_for_pruning(x, intra_sf);

    if (prune_intra_y_mode(this_model_rd, &best_model_rd, top_intra_model_rd,
                           intra_sf->top_intra_model_count_allowed,
                           model_rd_index_for_pruning))
      continue;

    // Builds the actual prediction. The prediction from
    // model_intra_yrd_and_prune was just an estimation that did not take into
    // account the effect of txfm pipeline, so we need to redo it for real
    // here.
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &this_rd_stats, bsize, best_rd);
    this_rate_tokenonly = this_rd_stats.rate;
    this_distortion = this_rd_stats.dist;
    s = this_rd_stats.skip_txfm;

    if (this_rate_tokenonly == INT_MAX) continue;

    if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
      // av1_pick_uniform_tx_size_type_yrd above includes the cost of the
      // tx_size in the tokenonly rate, but for intra blocks, tx_size is always
      // coded (prediction granularity), so we account for it in the full rate,
      // not the tokenonly rate.
      this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
    }
    this_rate =
        this_rd_stats.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
    this_rd = RDCOST(x->rdmult, this_rate, this_distortion);

    // Visual quality adjustment based on recon vs source variance.
    if ((cpi->oxcf.mode == ALLINTRA) && (this_rd != INT64_MAX)) {
      this_rd = (int64_t)(this_rd * intra_rd_variance_factor(cpi, x, bsize));
    }

    intra_modes_rd_cost[mbmi->mode][luma_delta_angle + MAX_ANGLE_DELTA + 1] =
        this_rd;

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, NULL, NULL, NULL, 0, NULL, bsize, this_rd,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      // Setting beat_best_rd flag because current mode rd is better than
      // best_rd passed to this function
      beat_best_rd = 1;
      *rate = this_rate;
      *rate_tokenonly = this_rate_tokenonly;
      *distortion = this_distortion;
      *skippable = s;
      memcpy(ctx->blk_skip, x->txfm_search_info.blk_skip,
             sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  // Searches palette
  if (try_palette) {
    av1_rd_pick_palette_intra_sby(
        cpi, x, bsize, bmode_costs[DC_PRED], &best_mbmi, best_palette_color_map,
        &best_rd, rate, rate_tokenonly, distortion, skippable, &beat_best_rd,
        ctx, ctx->blk_skip, ctx->tx_type_map);
  }

  // Searches filter_intra
  if (beat_best_rd && av1_filter_intra_allowed_bsize(&cpi->common, bsize)) {
    if (rd_pick_filter_intra_sby(cpi, x, rate, rate_tokenonly, distortion,
                                 skippable, bsize, bmode_costs[DC_PRED],
                                 best_mbmi.mode, &best_rd, &best_model_rd,
                                 ctx)) {
      best_mbmi = *mbmi;
    }
  }

  // No mode is identified with less rd value than best_rd passed to this
  // function. In such cases winner mode processing is not necessary and return
  // best_rd as INT64_MAX to indicate best mode is not identified
  if (!beat_best_rd) return INT64_MAX;

  // In multi-winner mode processing, perform tx search for few best modes
  // identified during mode evaluation. Winner mode processing uses best tx
  // configuration for tx search.
  if (cpi->sf.winner_mode_sf.multi_winner_mode_type) {
    int best_mode_idx = 0;
    int block_width, block_height;
    uint8_t *color_map_dst = xd->plane[PLANE_TYPE_Y].color_index_map;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);

    for (int mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++) {
      *mbmi = x->winner_mode_stats[mode_idx].mbmi;
      if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
        // Restore color_map of palette mode before winner mode processing
        if (mbmi->palette_mode_info.palette_size[0] > 0) {
          uint8_t *color_map_src =
              x->winner_mode_stats[mode_idx].color_index_map;
          memcpy(color_map_dst, color_map_src,
                 block_width * block_height * sizeof(*color_map_src));
        }
        // Set params for winner mode evaluation
        set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);

        // Winner mode processing
        // If previous searches use only the default tx type/no R-D optimization
        // of quantized coeffs, do an extra search for the best tx type/better
        // R-D optimization of quantized coeffs
        if (intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                            rate_tokenonly, distortion, skippable, &best_mbmi,
                            ctx))
          best_mode_idx = mode_idx;
      }
    }
    // Copy color_map of palette mode for final winner mode
    if (best_mbmi.palette_mode_info.palette_size[0] > 0) {
      uint8_t *color_map_src =
          x->winner_mode_stats[best_mode_idx].color_index_map;
      memcpy(color_map_dst, color_map_src,
             block_width * block_height * sizeof(*color_map_src));
    }
  } else {
    // If previous searches use only the default tx type/no R-D optimization of
    // quantized coeffs, do an extra search for the best tx type/better R-D
    // optimization of quantized coeffs
    if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
      // Set params for winner mode evaluation
      set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);
      *mbmi = best_mbmi;
      intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                      rate_tokenonly, distortion, skippable, &best_mbmi, ctx);
    }
  }
  *mbmi = best_mbmi;
  av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
  return best_rd;
}